

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EthBasePort.cpp
# Opt level: O2

void EthBasePort::PrintDebugData(ostream *debugStream,quadlet_t *data,double clockPeriod)

{
  bool bVar1;
  uint uVar2;
  ostream *poVar3;
  allocator<char> local_41;
  string local_40;
  
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_40,"PrintDebugData",&local_41)
  ;
  bVar1 = CheckDebugHeader(debugStream,&local_40,(char *)data,2);
  std::__cxx11::string::~string((string *)&local_40);
  if (bVar1) {
    poVar3 = std::operator<<(debugStream,"Timestamp: ");
    *(uint *)(poVar3 + *(long *)(*(long *)poVar3 + -0x18) + 0x18) =
         *(uint *)(poVar3 + *(long *)(*(long *)poVar3 + -0x18) + 0x18) & 0xffffffb5 | 8;
    poVar3 = std::ostream::_M_insert<unsigned_long>((ulong)poVar3);
    *(uint *)(poVar3 + *(long *)(*(long *)poVar3 + -0x18) + 0x18) =
         *(uint *)(poVar3 + *(long *)(*(long *)poVar3 + -0x18) + 0x18) & 0xffffffb5 | 2;
    std::endl<char,std::char_traits<char>>(poVar3);
    uVar2 = data[2];
    if ((int)uVar2 < 0) {
      std::operator<<(debugStream,"wrReq ");
      uVar2 = data[2];
    }
    if ((uVar2 >> 0x1d & 1) != 0) {
      std::operator<<(debugStream,"bw_active ");
      uVar2 = data[2];
    }
    if ((uVar2 >> 0x1c & 1) != 0) {
      std::operator<<(debugStream,"eth_send_idle ");
      uVar2 = data[2];
    }
    if ((uVar2 >> 0x1b & 1) != 0) {
      std::operator<<(debugStream,"eth_recv_idle ");
      uVar2 = data[2];
    }
    if ((uVar2 >> 0x1a & 1) != 0) {
      std::operator<<(debugStream,"UDPError ");
      uVar2 = data[2];
    }
    if ((uVar2 >> 0x18 & 1) != 0) {
      std::operator<<(debugStream,"IPV4Error ");
      uVar2 = data[2];
    }
    if ((uVar2 >> 0x17 & 1) != 0) {
      std::operator<<(debugStream,"sendBusy ");
      uVar2 = data[2];
    }
    if ((uVar2 >> 0x16 & 1) != 0) {
      std::operator<<(debugStream,"sendRequest ");
      uVar2 = data[2];
    }
    if ((uVar2 >> 0x15 & 1) != 0) {
      std::operator<<(debugStream,"eth_send_fw_ack ");
      uVar2 = data[2];
    }
    if ((uVar2 >> 0x14 & 1) != 0) {
      std::operator<<(debugStream,"eth_send_fw_req ");
    }
    std::endl<char,std::char_traits<char>>(debugStream);
    uVar2 = data[2];
    if ((uVar2 >> 0x13 & 1) != 0) {
      std::operator<<(debugStream,"recvBusy ");
      uVar2 = data[2];
    }
    if ((uVar2 >> 0x12 & 1) != 0) {
      std::operator<<(debugStream,"recvRequest ");
      uVar2 = data[2];
    }
    if ((uVar2 >> 0x11 & 1) != 0) {
      std::operator<<(debugStream,"isLocal ");
      uVar2 = data[2];
    }
    if ((uVar2 >> 0x10 & 1) != 0) {
      std::operator<<(debugStream,"isRemote ");
      uVar2 = data[2];
    }
    if ((short)uVar2 < 0) {
      std::operator<<(debugStream,"fwPacketFresh ");
      uVar2 = data[2];
    }
    if ((uVar2 >> 0xe & 1) != 0) {
      std::operator<<(debugStream,"isForward ");
      uVar2 = data[2];
    }
    if ((uVar2 >> 0xd & 1) != 0) {
      std::operator<<(debugStream,"sendARP ");
      uVar2 = data[2];
    }
    if ((uVar2 >> 0xc & 1) != 0) {
      std::operator<<(debugStream,"isUDP ");
      uVar2 = data[2];
    }
    if ((uVar2 >> 0xb & 1) != 0) {
      std::operator<<(debugStream,"isICMP  ");
      uVar2 = data[2];
    }
    if ((uVar2 >> 10 & 1) != 0) {
      std::operator<<(debugStream,"isEcho ");
      uVar2 = data[2];
    }
    if ((uVar2 >> 9 & 1) != 0) {
      std::operator<<(debugStream,"ipv4_long ");
      uVar2 = data[2];
    }
    if ((uVar2 >> 8 & 1) != 0) {
      std::operator<<(debugStream,"ipv4_short ");
      uVar2 = data[2];
    }
    if ((char)uVar2 < '\0') {
      std::operator<<(debugStream,"fw_bus_reset ");
      uVar2 = data[2];
    }
    if ((uVar2 & 0x40) != 0) {
      std::operator<<(debugStream,"ipWrite ");
      uVar2 = data[2];
    }
    if ((uVar2 & 0x20) != 0) {
      std::operator<<(debugStream,"hubSend ");
      uVar2 = data[2];
    }
    if ((uVar2 & 0x10) != 0) {
      std::operator<<(debugStream,"bcResp ");
    }
    std::endl<char,std::char_traits<char>>(debugStream);
    poVar3 = std::operator<<(debugStream,"FireWire node_id: ");
    poVar3 = std::ostream::_M_insert<unsigned_long>((ulong)poVar3);
    std::endl<char,std::char_traits<char>>(poVar3);
    poVar3 = std::operator<<(debugStream,"LengthFW: ");
    *(uint *)(poVar3 + *(long *)(*(long *)poVar3 + -0x18) + 0x18) =
         *(uint *)(poVar3 + *(long *)(*(long *)poVar3 + -0x18) + 0x18) & 0xffffffb5 | 2;
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,(ushort)data[3]);
    std::endl<char,std::char_traits<char>>(poVar3);
    poVar3 = std::operator<<(debugStream,"MaxCountFW: ");
    *(uint *)(poVar3 + *(long *)(*(long *)poVar3 + -0x18) + 0x18) =
         *(uint *)(poVar3 + *(long *)(*(long *)poVar3 + -0x18) + 0x18) & 0xffffffb5 | 2;
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,*(ushort *)((long)data + 0xe) & 0x3ff);
    std::endl<char,std::char_traits<char>>(poVar3);
    poVar3 = std::operator<<(debugStream,"FwCtrl: ");
    *(uint *)(poVar3 + *(long *)(*(long *)poVar3 + -0x18) + 0x18) =
         *(uint *)(poVar3 + *(long *)(*(long *)poVar3 + -0x18) + 0x18) & 0xffffffb5 | 8;
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,*(ushort *)((long)data + 0x12));
    std::endl<char,std::char_traits<char>>(poVar3);
    poVar3 = std::operator<<(debugStream,"Host FW Addr: ");
    *(uint *)(poVar3 + *(long *)(*(long *)poVar3 + -0x18) + 0x18) =
         *(uint *)(poVar3 + *(long *)(*(long *)poVar3 + -0x18) + 0x18) & 0xffffffb5 | 8;
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,(ushort)data[4]);
    std::endl<char,std::char_traits<char>>(poVar3);
    poVar3 = std::operator<<(debugStream,"Fw Bus Generation: ");
    *(uint *)(poVar3 + *(long *)(*(long *)poVar3 + -0x18) + 0x18) =
         *(uint *)(poVar3 + *(long *)(*(long *)poVar3 + -0x18) + 0x18) & 0xffffffb5 | 2;
    std::ostream::operator<<(poVar3,(ushort)*(byte *)((long)data + 0x1d));
    std::endl<char,std::char_traits<char>>(debugStream);
    poVar3 = std::operator<<(debugStream,"sendState: ");
    *(uint *)(poVar3 + *(long *)(*(long *)poVar3 + -0x18) + 0x18) =
         *(uint *)(poVar3 + *(long *)(*(long *)poVar3 + -0x18) + 0x18) & 0xffffffb5 | 2;
    poVar3 = (ostream *)
             std::ostream::operator<<(poVar3,(uint)(*(ushort *)((long)data + 0x16) >> 0xc));
    poVar3 = std::operator<<(poVar3,", recvState: ");
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,data[5] >> 0xc & 7);
    poVar3 = std::operator<<(poVar3,", nextRecv: ");
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,*(byte *)((long)data + 0x15) & 7);
    poVar3 = std::operator<<(poVar3,", recvCnt: ");
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,(ushort)data[5] & 0x3f);
    std::endl<char,std::char_traits<char>>(poVar3);
    poVar3 = std::operator<<(debugStream,"numIPv4: ");
    *(uint *)(poVar3 + *(long *)(*(long *)poVar3 + -0x18) + 0x18) =
         *(uint *)(poVar3 + *(long *)(*(long *)poVar3 + -0x18) + 0x18) & 0xffffffb5 | 2;
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,(ushort)data[6]);
    std::endl<char,std::char_traits<char>>(poVar3);
    poVar3 = std::operator<<(debugStream,"numUDP: ");
    *(uint *)(poVar3 + *(long *)(*(long *)poVar3 + -0x18) + 0x18) =
         *(uint *)(poVar3 + *(long *)(*(long *)poVar3 + -0x18) + 0x18) & 0xffffffb5 | 2;
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,*(ushort *)((long)data + 0x1a));
    std::endl<char,std::char_traits<char>>(poVar3);
    poVar3 = std::operator<<(debugStream,"numARP: ");
    *(uint *)(poVar3 + *(long *)(*(long *)poVar3 + -0x18) + 0x18) =
         *(uint *)(poVar3 + *(long *)(*(long *)poVar3 + -0x18) + 0x18) & 0xffffffb5 | 2;
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,(ushort)(byte)data[7]);
    std::endl<char,std::char_traits<char>>(poVar3);
    poVar3 = std::operator<<(debugStream,"numICMP: ");
    *(uint *)(poVar3 + *(long *)(*(long *)poVar3 + -0x18) + 0x18) =
         *(uint *)(poVar3 + *(long *)(*(long *)poVar3 + -0x18) + 0x18) & 0xffffffb5 | 2;
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,(ushort)*(byte *)((long)data + 0x1e));
    std::endl<char,std::char_traits<char>>(poVar3);
    poVar3 = std::operator<<(debugStream,"numMulticastWrite: ");
    *(uint *)(poVar3 + *(long *)(*(long *)poVar3 + -0x18) + 0x18) =
         *(uint *)(poVar3 + *(long *)(*(long *)poVar3 + -0x18) + 0x18) & 0xffffffb5 | 2;
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,(ushort)*(byte *)((long)data + 0x2a));
    std::endl<char,std::char_traits<char>>(poVar3);
    poVar3 = std::operator<<(debugStream,"br_wait: ");
    *(uint *)(poVar3 + *(long *)(*(long *)poVar3 + -0x18) + 0x18) =
         *(uint *)(poVar3 + *(long *)(*(long *)poVar3 + -0x18) + 0x18) & 0xffffffb5 | 2;
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,(ushort)*(byte *)((long)data + 0x1f));
    std::endl<char,std::char_traits<char>>(poVar3);
    poVar3 = std::operator<<(debugStream,"numPacketError: ");
    *(uint *)(poVar3 + *(long *)(*(long *)poVar3 + -0x18) + 0x18) =
         *(uint *)(poVar3 + *(long *)(*(long *)poVar3 + -0x18) + 0x18) & 0xffffffb5 | 2;
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,(ushort)(byte)data[8]);
    std::endl<char,std::char_traits<char>>(poVar3);
    poVar3 = std::operator<<(debugStream,"bwState: ");
    *(uint *)(poVar3 + *(long *)(*(long *)poVar3 + -0x18) + 0x18) =
         *(uint *)(poVar3 + *(long *)(*(long *)poVar3 + -0x18) + 0x18) & 0xffffffb5 | 2;
    std::ostream::operator<<(poVar3,*(byte *)((long)data + 0x21) & 7);
    if (*(char *)((long)data + 0x21) < '\0') {
      std::operator<<(debugStream,", bw_err");
    }
    poVar3 = std::endl<char,std::char_traits<char>>(debugStream);
    poVar3 = std::operator<<(poVar3,"bw_left: ");
    *(uint *)(poVar3 + *(long *)(*(long *)poVar3 + -0x18) + 0x18) =
         *(uint *)(poVar3 + *(long *)(*(long *)poVar3 + -0x18) + 0x18) & 0xffffffb5 | 2;
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,*(ushort *)((long)data + 0x22));
    std::endl<char,std::char_traits<char>>(poVar3);
    poVar3 = std::operator<<(debugStream,"fw_left: ");
    std::ostream::operator<<(poVar3,*(ushort *)((long)data + 0x26));
    if (*(char *)((long)data + 0x25) < '\0') {
      std::operator<<(debugStream,", fw_err");
    }
    poVar3 = std::operator<<(debugStream,", fw_wait_cnt: ");
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,(ushort)(byte)data[9]);
    std::endl<char,std::char_traits<char>>(poVar3);
    if ((short)data[10] != 0) {
      poVar3 = std::operator<<(debugStream,"Unsupported UDP port: ");
      poVar3 = (ostream *)std::ostream::operator<<(poVar3,(ushort)data[10]);
      std::endl<char,std::char_traits<char>>(poVar3);
    }
  }
  return;
}

Assistant:

void EthBasePort::PrintDebugData(std::ostream &debugStream, const quadlet_t *data, double clockPeriod)
{
    // Following structure must match DebugData in EthernetIO.v
    struct DebugData {
        char     header[4];        // Quad 0
        uint32_t timestampBegin;   // Quad 1
        uint32_t statusbits;       // Quad 2
        uint16_t LengthFW;         // Quad 3
        uint16_t quad3_high;
        uint16_t Host_FW_Addr;     // Quad 4
        uint16_t FwCtrl;
        uint16_t quad5_low;        // Quad 5
        uint16_t quad5_high;
        uint16_t numIPv4;          // Quad 6
        uint16_t numUDP;
        uint8_t  numARP;           // Quad 7
        uint8_t  fw_bus_gen;
        uint8_t  numICMP;
        uint8_t  br_wait_cnt;
        uint8_t  numPacketError;   // Quad 8
        uint8_t  bwState;
        uint16_t bw_left;
        uint8_t  fw_wait_cnt;      // Quad 9
        uint8_t  fwState;
        uint16_t fw_left;
        uint16_t port_unknown;     // Quad 10
        uint8_t  numMulticastWrite;
        uint8_t  quad10_high;
        uint32_t unused[5];        // Quads 10-15
    };
    if (sizeof(DebugData) != 16*sizeof(quadlet_t)) {
        debugStream << "PrintDebugData: structure packing problem" << std::endl;
        return;
    }
    const DebugData *p = reinterpret_cast<const DebugData *>(data);
    if (!CheckDebugHeader(debugStream, "PrintDebugData", p->header, 2))
        return;

    debugStream << "Timestamp: " << std::hex << p->timestampBegin << std::dec << std::endl;
    if (p->statusbits & 0x80000000) debugStream << "wrReq ";
    if (p->statusbits & 0x20000000) debugStream << "bw_active ";
    if (p->statusbits & 0x10000000) debugStream << "eth_send_idle ";
    if (p->statusbits & 0x08000000) debugStream << "eth_recv_idle ";
    if (p->statusbits & 0x04000000) debugStream << "UDPError ";
    if (p->statusbits & 0x01000000) debugStream << "IPV4Error ";
    if (p->statusbits & 0x00800000) debugStream << "sendBusy ";
    if (p->statusbits & 0x00400000) debugStream << "sendRequest ";
    if (p->statusbits & 0x00200000) debugStream << "eth_send_fw_ack ";
    if (p->statusbits & 0x00100000) debugStream << "eth_send_fw_req ";
    debugStream << std::endl;
    if (p->statusbits & 0x00080000) debugStream << "recvBusy ";
    if (p->statusbits & 0x00040000) debugStream << "recvRequest ";
    if (p->statusbits & 0x00020000) debugStream << "isLocal ";
    if (p->statusbits & 0x00010000) debugStream << "isRemote ";
    if (p->statusbits & 0x00008000) debugStream << "fwPacketFresh ";
    if (p->statusbits & 0x00004000) debugStream << "isForward ";
    if (p->statusbits & 0x00002000) debugStream << "sendARP ";
    if (p->statusbits & 0x00001000) debugStream << "isUDP ";
    if (p->statusbits & 0x00000800) debugStream << "isICMP  ";
    if (p->statusbits & 0x00000400) debugStream << "isEcho ";
    if (p->statusbits & 0x00000200) debugStream << "ipv4_long ";
    if (p->statusbits & 0x00000100) debugStream << "ipv4_short ";
    if (p->statusbits & 0x00000080) debugStream << "fw_bus_reset ";
    if (p->statusbits & 0x00000040) debugStream << "ipWrite ";
    if (p->statusbits & 0x00000020) debugStream << "hubSend ";
    if (p->statusbits & 0x00000010) debugStream << "bcResp ";
    debugStream << std::endl;
    unsigned int node_id = (p->quad3_high&0xfc00) >> 10;    // node_is is upper 6 bits
    debugStream << "FireWire node_id: " << node_id << std::endl;
    debugStream << "LengthFW: " << std::dec << p->LengthFW << std::endl;
    debugStream << "MaxCountFW: " << std::dec << (p->quad3_high&0x3ff) << std::endl;
    debugStream << "FwCtrl: " << std::hex << p->FwCtrl << std::endl;
    debugStream << "Host FW Addr: " << std::hex << p->Host_FW_Addr << std::endl;
    debugStream << "Fw Bus Generation: " << std::dec << static_cast<uint16_t>(p->fw_bus_gen);
    debugStream << std::endl;
    debugStream << "sendState: "   << std::dec << (p->quad5_high>>12)
                << ", recvState: " << ((p->quad5_low&0x7000)>>12)
                << ", nextRecv: "  << ((p->quad5_low&0x0700)>>8)
                << ", recvCnt: " << (p->quad5_low&0x003f) << std::endl;
    debugStream << "numIPv4: " << std::dec << p->numIPv4 << std::endl;
    debugStream << "numUDP: " << std::dec << p->numUDP << std::endl;
    debugStream << "numARP: " << std::dec << static_cast<uint16_t>(p->numARP) << std::endl;
    debugStream << "numICMP: " << std::dec << static_cast<uint16_t>(p->numICMP) << std::endl;
    debugStream << "numMulticastWrite: " << std::dec << static_cast<uint16_t>(p->numMulticastWrite) << std::endl;
    debugStream << "br_wait: " << std::dec << static_cast<uint16_t>(p->br_wait_cnt) << std::endl;
    debugStream << "numPacketError: " << std::dec << static_cast<uint16_t>(p->numPacketError) << std::endl;
    debugStream << "bwState: " << std::dec << static_cast<uint16_t>(p->bwState & 0x07);
    if (p->bwState & 0x80) debugStream << ", bw_err";
    debugStream << std::endl << "bw_left: " << std::dec << p->bw_left << std::endl;
    debugStream << "fw_left: " << p->fw_left;
    if (p->fwState & 0x80) debugStream << ", fw_err";
    debugStream << ", fw_wait_cnt: " << static_cast<uint16_t>(p->fw_wait_cnt) << std::endl;
    if (p->port_unknown)
        debugStream << "Unsupported UDP port: " << p->port_unknown << std::endl;
}